

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_avx2.cpp
# Opt level: O2

__m256i * sha256d64_avx2::anon_unknown_0::Read8
                    (__m256i *__return_storage_ptr__,uchar *chunk,int offset)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [32];
  
  lVar3 = (long)(int)chunk;
  auVar1 = vpinsrd_avx(ZEXT416(*(uint *)((long)__return_storage_ptr__[6] + lVar3)),
                       *(undefined4 *)((long)__return_storage_ptr__[4] + lVar3),1);
  auVar1 = vpinsrd_avx(auVar1,*(undefined4 *)((long)__return_storage_ptr__[2] + lVar3),2);
  auVar1 = vpinsrd_avx(auVar1,*(undefined4 *)((long)*__return_storage_ptr__ + lVar3),3);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)((long)__return_storage_ptr__[0xe] + lVar3)),
                       *(undefined4 *)((long)__return_storage_ptr__[0xc] + lVar3),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)((long)__return_storage_ptr__[10] + lVar3),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)((long)__return_storage_ptr__[8] + lVar3),3);
  if (*(__m256i **)(in_FS_OFFSET + 0x28) == *(__m256i **)(in_FS_OFFSET + 0x28)) {
    auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar4._16_16_ = ZEXT116(1) * auVar1;
    vpshufb_avx2(auVar4,_DAT_0074eee0);
    return *(__m256i **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

__m256i inline Read8(const unsigned char* chunk, int offset) {
    __m256i ret = _mm256_set_epi32(
        ReadLE32(chunk + 0 + offset),
        ReadLE32(chunk + 64 + offset),
        ReadLE32(chunk + 128 + offset),
        ReadLE32(chunk + 192 + offset),
        ReadLE32(chunk + 256 + offset),
        ReadLE32(chunk + 320 + offset),
        ReadLE32(chunk + 384 + offset),
        ReadLE32(chunk + 448 + offset)
    );
    return _mm256_shuffle_epi8(ret, _mm256_set_epi32(0x0C0D0E0FUL, 0x08090A0BUL, 0x04050607UL, 0x00010203UL, 0x0C0D0E0FUL, 0x08090A0BUL, 0x04050607UL, 0x00010203UL));
}